

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O1

bool __thiscall
DIS::LinearObjectStatePdu::operator==(LinearObjectStatePdu *this,LinearObjectStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  pointer pLVar11;
  long lVar12;
  ulong uVar13;
  
  bVar5 = SyntheticEnvironmentFamilyPdu::operator==
                    (&this->super_SyntheticEnvironmentFamilyPdu,
                     &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar6 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  bVar7 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  uVar3 = this->_updateNumber;
  uVar4 = rhs->_updateNumber;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  bVar8 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  bVar9 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  bVar10 = ObjectType::operator==(&this->_objectType,&rhs->_objectType);
  bVar5 = ((bVar10 && (bVar9 && bVar8)) && uVar2 == uVar1) &&
          (uVar3 == uVar4 && (bVar7 && (bVar6 && bVar5)));
  pLVar11 = (this->_linearSegmentParameters).
            super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_linearSegmentParameters).
      super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar11) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      bVar6 = LinearSegmentParameter::operator==
                        ((LinearSegmentParameter *)
                         ((long)&pLVar11->_vptr_LinearSegmentParameter + lVar12),
                         (LinearSegmentParameter *)
                         ((long)&((rhs->_linearSegmentParameters).
                                  super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_LinearSegmentParameter + lVar12));
      if (!bVar6) {
        bVar5 = false;
      }
      uVar13 = uVar13 + 1;
      pLVar11 = (this->_linearSegmentParameters).
                super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x50;
    } while (uVar13 < (ulong)(((long)(this->_linearSegmentParameters).
                                     super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar11 >> 4
                              ) * -0x3333333333333333));
  }
  return bVar5;
}

Assistant:

bool LinearObjectStatePdu::operator ==(const LinearObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        if( ! ( _linearSegmentParameters[idx] == rhs._linearSegmentParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }